

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O1

CNscPStackEntry * NscBuildCall(CNscPStackEntry *pFn,CNscPStackEntry *pArgList)

{
  byte *pbVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  CNwnDoubleLinkList *pCVar5;
  CNscPStackEntry *pCVar6;
  CNscContext *pCVar7;
  int iVar8;
  CNscPStackEntry *this;
  NscSymbol *pNVar9;
  CNwnDoubleLinkList *pCVar10;
  CNwnDoubleLinkList *pNext;
  size_t nDataSize;
  CNwnDoubleLinkList *pNext_1;
  char *pcVar11;
  int iVar12;
  NscMessage nMessage;
  long *pauchData;
  long *plVar13;
  uint uVar14;
  long *plVar15;
  bool bVar16;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar7 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pFn != (CNscPStackEntry *)0x0) {
      pCVar5 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar6 = (CNscPStackEntry *)(pFn->m_link).m_pNext;
      if (pCVar6 != pFn) {
        pCVar10 = (pFn->m_link).m_pPrev;
        (pCVar6->m_link).m_pPrev = pCVar10;
        pCVar10->m_pNext = (CNwnDoubleLinkList *)pCVar6;
        (pFn->m_link).m_pNext = &pFn->m_link;
        (pFn->m_link).m_pPrev = &pFn->m_link;
      }
      pCVar10 = &pCVar7->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar7->m_listEntryFree == pFn) {
        pCVar10 = pCVar5;
      }
      pCVar5 = pCVar10->m_pNext;
      (pFn->m_link).m_pNext = pCVar5;
      (pFn->m_link).m_pPrev = pCVar10;
      pCVar10->m_pNext = &pFn->m_link;
      pCVar5->m_pPrev = &pFn->m_link;
    }
    pCVar7 = g_pCtx;
    if (pArgList != (CNscPStackEntry *)0x0) {
      pCVar5 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar6 = (CNscPStackEntry *)(pArgList->m_link).m_pNext;
      if (pCVar6 != pArgList) {
        pCVar10 = (pArgList->m_link).m_pPrev;
        (pCVar6->m_link).m_pPrev = pCVar10;
        pCVar10->m_pNext = (CNwnDoubleLinkList *)pCVar6;
        (pArgList->m_link).m_pNext = &pArgList->m_link;
        (pArgList->m_link).m_pPrev = &pArgList->m_link;
      }
      pCVar10 = &pCVar7->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar7->m_listEntryFree == pArgList) {
        pCVar10 = pCVar5;
      }
      pCVar5 = pCVar10->m_pNext;
      (pArgList->m_link).m_pNext = pCVar5;
      (pArgList->m_link).m_pPrev = pCVar10;
      pCVar10->m_pNext = &pArgList->m_link;
      pCVar5->m_pPrev = &pArgList->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Unknown;
      return this;
    }
  }
  else {
    if (pFn == (CNscPStackEntry *)0x0) {
      __assert_fail("pFn",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x11d2,"CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
    }
    pNVar9 = CNscSymbolTable::FindByType(&g_pCtx->m_sSymbols,pFn->m_pszId,0xfffffff7);
    if (pNVar9 == (NscSymbol *)0x0) {
      pcVar11 = pFn->m_pszId;
      nMessage = NscMessage_ErrorUndeclaredIdentifier;
    }
    else if (pNVar9->nSymType == NscSymType_Function) {
      if (pArgList == (CNscPStackEntry *)0x0) {
        nDataSize = 0;
        pauchData = (long *)0x0;
      }
      else {
        pauchData = (long *)pArgList->m_pauchData;
        nDataSize = pArgList->m_nDataSize;
      }
      piVar2 = (int *)((g_pCtx->m_sSymbols).m_pauchData + (pNVar9->field_6).field_1.nFirstBackLink);
      plVar13 = (long *)(piVar2 + 0xc);
      iVar12 = *piVar2;
      uVar14 = 0;
      plVar15 = pauchData;
      do {
        if ((iVar12 < 1) || ((long *)((long)pauchData + nDataSize) <= plVar15)) break;
        if ((int)plVar15[1] != 2) {
          __assert_fail("p1 ->nOpCode == NscPCode_Argument",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x1216,
                        "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
        }
        if ((int)plVar13[1] != 1) {
          __assert_fail("p2 ->nOpCode == NscPCode_Declaration",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                        ,0x1217,
                        "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
        }
        uVar14 = uVar14 + 1;
        uVar3 = *(uint *)((long)plVar15 + 0xc);
        if (uVar3 == 2) {
LAB_00151ac4:
          if (this->m_nType != NscType_Unknown) goto LAB_00151c5c;
          this->m_nType = NscType_Error;
          iVar8 = 3;
        }
        else {
          uVar4 = *(uint *)((long)plVar13 + 0xc);
          if (uVar4 == 2) goto LAB_00151ac4;
          if (uVar3 == uVar4) {
LAB_00151b79:
            plVar15 = (long *)((long)plVar15 + *plVar15);
            plVar13 = (long *)((long)plVar13 + *plVar13);
            iVar12 = iVar12 + -1;
            iVar8 = 0;
          }
          else {
            bVar16 = true;
            if (((uVar3 == 1) && (uVar4 == 3)) && (0x2f < (ulong)plVar15[2])) {
              if (*(int *)((long)plVar15 + plVar15[3] + 8) == 4) {
                bVar16 = *(ulong *)((long)plVar15 + plVar15[3]) != plVar15[2];
              }
              if (!bVar16) {
                *(undefined4 *)((long)plVar15 + 0xc) = 3;
              }
            }
            iVar8 = 0;
            if (bVar16) {
              CNscContext::GenerateMessage
                        (g_pCtx,NscMessage_ErrorFunctionArgTypeMismatch,pFn->m_pszId,
                         (undefined4 *)((long)plVar13 + 0x3c),(ulong)uVar14,(ulong)uVar4,
                         *(undefined4 *)((long)plVar15 + 0xc));
              if (this->m_nType != NscType_Unknown) goto LAB_00151c5c;
              this->m_nType = NscType_Error;
              iVar8 = 3;
            }
            if (!bVar16) goto LAB_00151b79;
          }
        }
      } while (iVar8 == 0);
      if (this->m_nType == NscType_Error) goto LAB_001519a5;
      if ((long *)((long)pauchData + nDataSize) <= plVar15) {
        do {
          if (iVar12 < 1) break;
          if ((int)plVar13[1] != 1) {
            __assert_fail("p2 ->nOpCode == NscPCode_Declaration",
                          "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                          ,0x127f,
                          "CNscPStackEntry *NscBuildCall(CNscPStackEntry *, CNscPStackEntry *)");
          }
          if (*(int *)((long)plVar13 + 0xc) == 2) {
LAB_00151bfc:
            if (this->m_nType != NscType_Unknown) goto LAB_00151c5c;
            this->m_nType = NscType_Error;
            bVar16 = false;
          }
          else {
            if (plVar13[3] == 0) {
              CNscContext::GenerateMessage
                        (g_pCtx,NscMessage_ErrorRequiredFunctionArgMissing,
                         (undefined4 *)((long)plVar13 + 0x3c),pFn->m_pszId);
              goto LAB_00151bfc;
            }
            plVar13 = (long *)((long)plVar13 + *plVar13);
            iVar12 = iVar12 + -1;
            bVar16 = true;
          }
        } while (bVar16);
        if (iVar12 < 1) {
          CNscPStackEntry::PushCall
                    (this,(pNVar9->field_6).field_2.nType,
                     (long)pNVar9 - (long)(g_pCtx->m_sSymbols).m_pauchData,(long)(int)uVar14,
                     (uchar *)pauchData,nDataSize);
          if (this->m_nType != NscType_Unknown) goto LAB_00151c5c;
          this->m_nType = (pNVar9->field_6).field_0.nToken;
        }
        pbVar1 = (byte *)((long)&pNVar9->field_6 + 7);
        *pbVar1 = *pbVar1 | 4;
        goto LAB_001519a5;
      }
      pcVar11 = pFn->m_pszId;
      nMessage = NscMessage_ErrorTooManyFunctionArgs;
    }
    else {
      pcVar11 = pFn->m_pszId;
      nMessage = NscMessage_ErrorCantInvokeIdentAsFunction;
    }
    CNscContext::GenerateMessage(g_pCtx,nMessage,pcVar11);
    if (this->m_nType == NscType_Unknown) {
      this->m_nType = NscType_Error;
LAB_001519a5:
      pCVar7 = g_pCtx;
      pCVar5 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar6 = (CNscPStackEntry *)(pFn->m_link).m_pNext;
      if (pCVar6 != pFn) {
        pCVar10 = (pFn->m_link).m_pPrev;
        (pCVar6->m_link).m_pPrev = pCVar10;
        pCVar10->m_pNext = (CNwnDoubleLinkList *)pCVar6;
        (pFn->m_link).m_pNext = &pFn->m_link;
        (pFn->m_link).m_pPrev = &pFn->m_link;
      }
      pCVar10 = &pCVar7->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar7->m_listEntryFree == pFn) {
        pCVar10 = pCVar5;
      }
      pCVar5 = pCVar10->m_pNext;
      (pFn->m_link).m_pNext = pCVar5;
      (pFn->m_link).m_pPrev = pCVar10;
      pCVar10->m_pNext = &pFn->m_link;
      pCVar5->m_pPrev = &pFn->m_link;
      pCVar7 = g_pCtx;
      if (pArgList != (CNscPStackEntry *)0x0) {
        pCVar5 = (g_pCtx->m_listEntryFree).m_pPrev;
        pCVar6 = (CNscPStackEntry *)(pArgList->m_link).m_pNext;
        if (pCVar6 != pArgList) {
          pCVar10 = (pArgList->m_link).m_pPrev;
          (pCVar6->m_link).m_pPrev = pCVar10;
          pCVar10->m_pNext = (CNwnDoubleLinkList *)pCVar6;
          (pArgList->m_link).m_pNext = &pArgList->m_link;
          (pArgList->m_link).m_pPrev = &pArgList->m_link;
        }
        pCVar10 = &pCVar7->m_listEntryFree;
        if ((CNscPStackEntry *)&pCVar7->m_listEntryFree == pArgList) {
          pCVar10 = pCVar5;
        }
        pCVar5 = pCVar10->m_pNext;
        (pArgList->m_link).m_pNext = pCVar5;
        (pArgList->m_link).m_pPrev = pCVar10;
        pCVar10->m_pNext = &pArgList->m_link;
        pCVar5->m_pPrev = &pArgList->m_link;
      }
      return this;
    }
  }
LAB_00151c5c:
  __assert_fail("m_nType == NscType_Unknown",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0xee,"void CNscPStackEntry::SetType(NscType)");
}

Assistant:

YYSTYPE NscBuildCall (YYSTYPE pFn, YYSTYPE pArgList)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	
	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pFn)
			g_pCtx ->FreePStackEntry (pFn);
		if (pArgList)
			g_pCtx ->FreePStackEntry (pArgList);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Search for the function in the symbol table
	//

	assert (pFn);
	NscSymbol *pSymbol = g_pCtx ->FindDeclSymbol (
		pFn ->GetIdentifier ());
	
	//
	// If the identifier wasn't found
	//

	if (pSymbol == NULL)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorUndeclaredIdentifier,
			pFn ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// If this is not a function
	//

	else if (pSymbol ->nSymType != NscSymType_Function)
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorCantInvokeIdentAsFunction,
			pFn ->GetIdentifier ());
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we have a good symbol
	//

	else
	{

		//
		// Get a pointer to the arguments
		//

		unsigned char *pauchStartData = NULL;
		size_t nDataSize = 0;
		if (pArgList)
		{
			pauchStartData = pArgList ->GetData ();
			nDataSize = pArgList ->GetDataSize ();
		}
		unsigned char *pauchData = pauchStartData;
		unsigned char *pauchEnd = &pauchData [nDataSize];

		//
		// Count the number of arguments while we make sure 
		// we don't have any type mismatches
		//

		int nArgCount = 0;
		unsigned char *pauchFnData = g_pCtx ->GetSymbolData (pSymbol ->nExtra);
		NscSymbolFunctionExtra *pfnExtra = (NscSymbolFunctionExtra *) pauchFnData;
		int nFnArgCount = pfnExtra ->nArgCount;
		pauchFnData += sizeof (NscSymbolFunctionExtra);
		while (nFnArgCount > 0 && pauchData < pauchEnd)
		{

			//
			// Get the next pair.  Arguments from the call 
			// and declarations from the prototype.
			//

			nArgCount++;
			NscPCodeArgument *p1 = (NscPCodeArgument *) pauchData;
			NscPCodeDeclaration *p2 = (NscPCodeDeclaration *) pauchFnData;
			assert (p1 ->nOpCode == NscPCode_Argument);
			assert (p2 ->nOpCode == NscPCode_Declaration);

			//
			// Check for soft errors
			//

			if (p1 ->nType == NscType_Error ||
				p2 ->nType == NscType_Error)
			{
				pOut ->SetType (NscType_Error);
				break;
			}

			//
			// Check for mismatch
			//

			if (p1 ->nType != p2 ->nType)
			{

				//
				// If the declaration type is action and the
				// argument is a void with just a call, then
				// this is really a match.
				//
				// ALSO, mutate the type of the argument
				// to an ACTION.
				//

				bool fIsBad = true;
				if (p2 ->nType == NscType_Action &&
					p1 ->nType == NscType_Void &&
					p1 ->nDataSize >= sizeof (NscPCodeCall))
				{
					NscPCodeCall *pc = (NscPCodeCall *)
						&pauchData [p1 ->nDataOffset];
					fIsBad = pc ->nOpCode != NscPCode_Call ||
						pc ->nOpSize != p1 ->nDataSize;
					if (!fIsBad)
					{
						p1 ->nType = NscType_Action;
					}
				}

				//
				// If really bad
				//

				if (fIsBad)
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorFunctionArgTypeMismatch,
						pFn ->GetIdentifier (), p2 ->szString, nArgCount,
						p2 ->nType, p1 ->nType);
					pOut ->SetType (NscType_Error);
					break;
				}
			}

			//
			// Move onto the next argument
			//

			pauchData += p1 ->nOpSize;
			pauchFnData += p2 ->nOpSize;
			nFnArgCount--;
		}

		//
		// If there wasn't an error
		//

		if (pOut ->GetType () != NscType_Error)
		{

			//
			// Make sure we don't have extra arguments
			//

			if (pauchData < pauchEnd)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorTooManyFunctionArgs,
					pFn ->GetIdentifier ());
				pOut ->SetType (NscType_Error);
			}

			//
			// Otherwise
			//

			else 
			{

				//
				// Check to make sure all the remaining arguments are optional
				//

				while (nFnArgCount > 0)
				{

					//
					// Get declaration information
					//

					NscPCodeDeclaration *p2 = (NscPCodeDeclaration *) pauchFnData;
					assert (p2 ->nOpCode == NscPCode_Declaration);

					//
					// Check for soft errors
					//

					if (p2 ->nType == NscType_Error)
					{
						pOut ->SetType (NscType_Error);
						break;
					}

					//
					// Make sure it is optional
					//

					if (p2 ->nDataSize == 0)
					{
						g_pCtx ->GenerateMessage (NscMessage_ErrorRequiredFunctionArgMissing,
							p2 ->szString,
							pFn ->GetIdentifier ());
						pOut ->SetType (NscType_Error);
						break;
					}

					//
					// Move to the next function argument
					//

					pauchFnData += p2 ->nOpSize;
					nFnArgCount--;
				}

				//
				// If all were optional, add the call
				//

				if (nFnArgCount <= 0)
				{
					pOut ->PushCall (pSymbol ->nType, 
						g_pCtx ->GetSymbolOffset (pSymbol), 
						nArgCount, pauchStartData, nDataSize);
					pOut ->SetType (pSymbol ->nType);
				}

				//
				// Mark the function as called so that we do not allow the
				// prototype return value to be relaxed later on
				//

				NscParserReferenceSymbol (pSymbol);
			}
		}
	}

	//
	// Rundown
	//

	g_pCtx ->FreePStackEntry (pFn);
	if (pArgList)
		g_pCtx ->FreePStackEntry (pArgList);
	return pOut;
}